

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testGroupStarting(XmlReporter *this,GroupInfo *groupInfo)

{
  XmlWriter *attribute;
  string *in_RDI;
  GroupInfo *in_stack_ffffffffffffff68;
  allocator *paVar1;
  StreamingReporterBase *in_stack_ffffffffffffff70;
  XmlWriter *this_00;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  StreamingReporterBase::testGroupStarting(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  this_00 = (XmlWriter *)&in_RDI[0xe].field_2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Group",&local_31);
  attribute = XmlWriter::startElement
                        ((XmlWriter *)in_stack_ffffffffffffff70,&in_stack_ffffffffffffff68->name);
  paVar1 = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"name",paVar1);
  XmlWriter::writeAttribute(this_00,in_RDI,(string *)attribute);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

virtual void testGroupStarting( GroupInfo const& groupInfo ) {
            StreamingReporterBase::testGroupStarting( groupInfo );
            m_xml.startElement( "Group" )
                .writeAttribute( "name", groupInfo.name );
        }